

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManComputeLevel(Fx_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Vec_Int_t *pVVar2;
  int local_24;
  int local_20;
  int iFirst;
  int iVar;
  int i;
  Vec_Int_t *vCube;
  Fx_Man_t *p_local;
  
  local_24 = 0;
  pVVar2 = Vec_WecEntry(p->vCubes,0);
  local_20 = Vec_IntEntry(pVVar2,0);
  pVVar2 = Vec_IntStart(p->nVars);
  p->vLevels = pVVar2;
  for (iFirst = 0; iVar1 = Vec_WecSize(p->vCubes), iFirst < iVar1; iFirst = iFirst + 1) {
    pVVar2 = Vec_WecEntry(p->vCubes,iFirst);
    iVar1 = Vec_IntEntry(pVVar2,0);
    if (local_20 != iVar1) {
      Vec_IntAddToEntry(p->vLevels,local_20,iFirst - local_24);
      local_20 = Vec_IntEntry(pVVar2,0);
      local_24 = iFirst;
    }
    p_00 = p->vLevels;
    iVar1 = Fx_ManComputeLevelCube(p,pVVar2);
    Vec_IntUpdateEntry(p_00,local_20,iVar1);
  }
  return;
}

Assistant:

void Fx_ManComputeLevel( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    int i, iVar, iFirst = 0;
    iVar = Vec_IntEntry( Vec_WecEntry(p->vCubes,0), 0 );
    p->vLevels = Vec_IntStart( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry(vCube, 0) )
        {
            // add the number of cubes
            Vec_IntAddToEntry( p->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry(vCube, 0);
            iFirst = i;
        }
        Vec_IntUpdateEntry( p->vLevels, iVar, Fx_ManComputeLevelCube(p, vCube) );
    }
}